

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

void __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::StringRefBase
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,C *p)

{
  size_t sVar1;
  
  *(undefined8 *)((long)&this->m_hdr + 1) = 0;
  *(undefined8 *)((long)&this->m_length + 1) = 0;
  this->m_p = (C *)0x0;
  this->m_hdr = (BufHdr *)0x0;
  if (p == (C *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(p);
  }
  attachBufHdr(this,(BufHdr *)0x0);
  this->m_p = p;
  this->m_length = sVar1;
  this->m_isNullTerminated = p != (C *)0x0;
  return;
}

Assistant:

StringRefBase(const C* p) {
		initialize();
		attach(NULL, p, Details::calcLength(p), p != NULL);
	}